

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_intra_pred_filters_ssse3_intr.c
# Opt level: O0

void ihevc_intra_pred_luma_mode_18_34_ssse3
               (UWORD8 *pu1_ref,WORD32 src_strd,UWORD8 *pu1_dst,WORD32 dst_strd,WORD32 nt,
               WORD32 mode)

{
  undefined1 (*pauVar1) [16];
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  int iVar23;
  long lVar24;
  long lVar25;
  undefined8 *puVar26;
  undefined8 *puVar27;
  int in_ECX;
  undefined8 *in_RDX;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int temp4_1;
  int temp3_1;
  int temp2_1;
  int temp1_1;
  __m128i src_temp16;
  __m128i src_temp15;
  __m128i src_temp14;
  __m128i src_temp13;
  __m128i src_temp12;
  __m128i src_temp11;
  __m128i src_temp10;
  __m128i src_temp9;
  int temp4;
  int temp3;
  int temp2;
  int temp1;
  __m128i src_temp8;
  __m128i src_temp7;
  __m128i src_temp6;
  __m128i src_temp5;
  __m128i src_temp4;
  __m128i src_temp3;
  __m128i src_temp2;
  __m128i src_temp1;
  WORD32 two_nt;
  WORD32 row;
  undefined8 local_ba8;
  undefined8 local_b98;
  undefined8 local_b88;
  undefined8 local_b78;
  undefined8 local_b68;
  undefined8 local_b58;
  undefined8 local_b48;
  int local_b20;
  undefined8 *local_b10;
  long local_b00;
  undefined4 local_108;
  undefined4 local_e8;
  undefined4 local_c8;
  undefined4 local_a8;
  undefined4 uStack_88;
  __m128i src_temp16_1;
  __m128i src_temp15_1;
  __m128i src_temp14_1;
  __m128i src_temp13_1;
  __m128i src_temp12_1;
  __m128i src_temp11_1;
  __m128i src_temp10_1;
  __m128i src_temp9_1;
  
  iVar23 = in_R8D << 1;
  local_b10 = in_RDX;
  local_b00 = in_RDI;
  if (in_R9D == 0x22) {
    if (in_R8D == 4) {
      src_temp11_1[1]._0_4_ = (undefined4)*(undefined8 *)(in_RDI + 2 + (long)iVar23);
      src_temp13_1[1]._0_4_ = (undefined4)*(undefined8 *)(in_RDI + 3 + (long)iVar23);
      src_temp15_1[1]._0_4_ = (undefined4)*(undefined8 *)(in_RDI + 4 + (long)iVar23);
      uStack_88 = (undefined4)*(undefined8 *)(in_RDI + 5 + (long)iVar23);
      *(undefined4 *)in_RDX = (undefined4)src_temp11_1[1];
      *(undefined4 *)((long)in_RDX + (long)in_ECX) = (undefined4)src_temp13_1[1];
      *(undefined4 *)((long)in_RDX + (long)(in_ECX << 1)) = (undefined4)src_temp15_1[1];
      *(undefined4 *)((long)in_RDX + (long)(in_ECX * 3)) = uStack_88;
    }
    else if (in_R8D == 8) {
      uVar2 = *(undefined8 *)(in_RDI + 3 + (long)iVar23);
      uVar3 = *(undefined8 *)(in_RDI + 4 + (long)iVar23);
      uVar4 = *(undefined8 *)(in_RDI + 5 + (long)iVar23);
      uVar5 = *(undefined8 *)(in_RDI + 6 + (long)iVar23);
      uVar6 = *(undefined8 *)(in_RDI + 7 + (long)iVar23);
      uVar7 = *(undefined8 *)(in_RDI + 8 + (long)iVar23);
      uVar8 = *(undefined8 *)(in_RDI + 9 + (long)iVar23);
      *in_RDX = *(undefined8 *)(in_RDI + 2 + (long)iVar23);
      *(undefined8 *)((long)in_RDX + (long)in_ECX) = uVar2;
      *(undefined8 *)((long)in_RDX + (long)(in_ECX * 2)) = uVar3;
      *(undefined8 *)((long)in_RDX + (long)(in_ECX * 3)) = uVar4;
      *(undefined8 *)((long)in_RDX + (long)(in_ECX << 2)) = uVar5;
      *(undefined8 *)((long)in_RDX + (long)(in_ECX * 5)) = uVar6;
      *(undefined8 *)((long)in_RDX + (long)(in_ECX * 6)) = uVar7;
      *(undefined8 *)((long)in_RDX + (long)(in_ECX * 7)) = uVar8;
    }
    else if (in_R8D == 0x10) {
      for (local_b20 = 0; local_b20 < 0x10; local_b20 = local_b20 + 8) {
        lVar24 = in_RDI + iVar23 + (long)local_b20;
        uVar2 = *(undefined8 *)(lVar24 + 10);
        lVar25 = in_RDI + iVar23 + (long)(local_b20 + 1);
        uVar3 = *(undefined8 *)(lVar25 + 2);
        uVar4 = *(undefined8 *)(lVar25 + 10);
        lVar25 = in_RDI + iVar23 + (long)(local_b20 + 2);
        uVar5 = *(undefined8 *)(lVar25 + 2);
        uVar6 = *(undefined8 *)(lVar25 + 10);
        lVar25 = in_RDI + iVar23 + (long)(local_b20 + 3);
        uVar7 = *(undefined8 *)(lVar25 + 2);
        uVar8 = *(undefined8 *)(lVar25 + 10);
        lVar25 = in_RDI + iVar23 + (long)(local_b20 + 4);
        uVar9 = *(undefined8 *)(lVar25 + 2);
        uVar10 = *(undefined8 *)(lVar25 + 10);
        lVar25 = in_RDI + iVar23 + (long)(local_b20 + 5);
        uVar11 = *(undefined8 *)(lVar25 + 2);
        uVar12 = *(undefined8 *)(lVar25 + 10);
        lVar25 = in_RDI + iVar23 + (long)(local_b20 + 6);
        uVar13 = *(undefined8 *)(lVar25 + 2);
        uVar14 = *(undefined8 *)(lVar25 + 10);
        lVar25 = in_RDI + iVar23 + (long)(local_b20 + 7);
        uVar15 = *(undefined8 *)(lVar25 + 2);
        uVar16 = *(undefined8 *)(lVar25 + 10);
        puVar26 = (undefined8 *)((long)in_RDX + (long)(local_b20 * in_ECX));
        *puVar26 = *(undefined8 *)(lVar24 + 2);
        puVar26[1] = uVar2;
        puVar26 = (undefined8 *)((long)in_RDX + (long)((local_b20 + 1) * in_ECX));
        *puVar26 = uVar3;
        puVar26[1] = uVar4;
        puVar26 = (undefined8 *)((long)in_RDX + (long)((local_b20 + 2) * in_ECX));
        *puVar26 = uVar5;
        puVar26[1] = uVar6;
        puVar26 = (undefined8 *)((long)in_RDX + (long)((local_b20 + 3) * in_ECX));
        *puVar26 = uVar7;
        puVar26[1] = uVar8;
        puVar26 = (undefined8 *)((long)in_RDX + (long)((local_b20 + 4) * in_ECX));
        *puVar26 = uVar9;
        puVar26[1] = uVar10;
        puVar26 = (undefined8 *)((long)in_RDX + (long)((local_b20 + 5) * in_ECX));
        *puVar26 = uVar11;
        puVar26[1] = uVar12;
        puVar26 = (undefined8 *)((long)in_RDX + (long)((local_b20 + 6) * in_ECX));
        *puVar26 = uVar13;
        puVar26[1] = uVar14;
        puVar26 = (undefined8 *)((long)in_RDX + (long)((local_b20 + 7) * in_ECX));
        *puVar26 = uVar15;
        puVar26[1] = uVar16;
      }
    }
    else {
      for (local_b20 = 0; local_b20 < in_R8D; local_b20 = local_b20 + 8) {
        uVar2 = *(undefined8 *)(local_b00 + iVar23 + 10);
        uVar3 = *(undefined8 *)(local_b00 + iVar23 + 0x12);
        uVar4 = *(undefined8 *)(local_b00 + iVar23 + 0x1a);
        uVar5 = *(undefined8 *)(local_b00 + iVar23 + 3);
        uVar6 = *(undefined8 *)(local_b00 + iVar23 + 0xb);
        uVar7 = *(undefined8 *)(local_b00 + iVar23 + 0x13);
        uVar8 = *(undefined8 *)(local_b00 + iVar23 + 0x1b);
        uVar9 = *(undefined8 *)(local_b00 + iVar23 + 4);
        uVar10 = *(undefined8 *)(local_b00 + iVar23 + 0xc);
        uVar11 = *(undefined8 *)(local_b00 + iVar23 + 0x14);
        uVar12 = *(undefined8 *)(local_b00 + iVar23 + 0x1c);
        uVar13 = *(undefined8 *)(local_b00 + iVar23 + 5);
        uVar14 = *(undefined8 *)(local_b00 + iVar23 + 0xd);
        uVar15 = *(undefined8 *)(local_b00 + iVar23 + 0x15);
        uVar16 = *(undefined8 *)(local_b00 + iVar23 + 0x1d);
        *local_b10 = *(undefined8 *)(local_b00 + iVar23 + 2);
        local_b10[1] = uVar2;
        local_b10[2] = uVar3;
        local_b10[3] = uVar4;
        *(undefined8 *)((long)local_b10 + (long)in_ECX) = uVar5;
        ((undefined8 *)((long)local_b10 + (long)in_ECX))[1] = uVar6;
        puVar26 = (undefined8 *)((long)local_b10 + (long)in_ECX + 0x10);
        *puVar26 = uVar7;
        puVar26[1] = uVar8;
        puVar26 = (undefined8 *)((long)local_b10 + (long)(in_ECX << 1));
        *puVar26 = uVar9;
        puVar26[1] = uVar10;
        puVar26 = (undefined8 *)((long)local_b10 + (long)(in_ECX << 1) + 0x10);
        *puVar26 = uVar11;
        puVar26[1] = uVar12;
        puVar26 = (undefined8 *)((long)local_b10 + (long)(in_ECX * 3));
        *puVar26 = uVar13;
        puVar26[1] = uVar14;
        puVar26 = (undefined8 *)((long)local_b10 + (long)(in_ECX * 3) + 0x10);
        *puVar26 = uVar15;
        puVar26[1] = uVar16;
        uVar2 = *(undefined8 *)(local_b00 + iVar23 + 0xe);
        uVar3 = *(undefined8 *)(local_b00 + iVar23 + 0x16);
        uVar4 = *(undefined8 *)(local_b00 + iVar23 + 0x1e);
        uVar5 = *(undefined8 *)(local_b00 + iVar23 + 7);
        uVar6 = *(undefined8 *)(local_b00 + iVar23 + 0xf);
        uVar7 = *(undefined8 *)(local_b00 + iVar23 + 0x17);
        uVar8 = *(undefined8 *)(local_b00 + iVar23 + 0x1f);
        uVar9 = *(undefined8 *)(local_b00 + iVar23 + 8);
        uVar10 = *(undefined8 *)(local_b00 + iVar23 + 0x10);
        uVar11 = *(undefined8 *)(local_b00 + iVar23 + 0x18);
        uVar12 = *(undefined8 *)(local_b00 + iVar23 + 0x20);
        uVar13 = *(undefined8 *)(local_b00 + iVar23 + 9);
        uVar14 = *(undefined8 *)(local_b00 + iVar23 + 0x11);
        uVar15 = *(undefined8 *)(local_b00 + iVar23 + 0x19);
        uVar16 = *(undefined8 *)(local_b00 + iVar23 + 0x21);
        puVar26 = (undefined8 *)((long)local_b10 + (long)(in_ECX << 2));
        *puVar26 = *(undefined8 *)(local_b00 + iVar23 + 6);
        puVar26[1] = uVar2;
        puVar26 = (undefined8 *)((long)local_b10 + (long)(in_ECX << 2) + 0x10);
        *puVar26 = uVar3;
        puVar26[1] = uVar4;
        puVar26 = (undefined8 *)((long)local_b10 + (long)(in_ECX * 5));
        *puVar26 = uVar5;
        puVar26[1] = uVar6;
        puVar26 = (undefined8 *)((long)local_b10 + (long)(in_ECX * 5) + 0x10);
        *puVar26 = uVar7;
        puVar26[1] = uVar8;
        puVar26 = (undefined8 *)((long)local_b10 + (long)(in_ECX * 6));
        *puVar26 = uVar9;
        puVar26[1] = uVar10;
        puVar26 = (undefined8 *)((long)local_b10 + (long)(in_ECX * 6) + 0x10);
        *puVar26 = uVar11;
        puVar26[1] = uVar12;
        puVar26 = (undefined8 *)((long)local_b10 + (long)(in_ECX * 7));
        *puVar26 = uVar13;
        puVar26[1] = uVar14;
        puVar26 = (undefined8 *)((long)local_b10 + (long)(in_ECX * 7) + 0x10);
        *puVar26 = uVar15;
        puVar26[1] = uVar16;
        local_b00 = local_b00 + 8;
        local_b10 = (undefined8 *)((long)local_b10 + (long)(in_ECX << 3));
      }
    }
  }
  else if (in_R8D == 4) {
    pauVar1 = (undefined1 (*) [16])(in_RDI + -3 + (long)iVar23);
    local_a8 = SUB164(*pauVar1,3);
    local_c8 = SUB164(*pauVar1,2);
    local_e8 = SUB164(*pauVar1,1);
    local_108 = (undefined4)*(undefined8 *)*pauVar1;
    *(undefined4 *)in_RDX = local_a8;
    *(undefined4 *)((long)in_RDX + (long)in_ECX) = local_c8;
    *(undefined4 *)((long)in_RDX + (long)(in_ECX << 1)) = local_e8;
    *(undefined4 *)((long)in_RDX + (long)(in_ECX * 3)) = local_108;
  }
  else if (in_R8D == 8) {
    pauVar1 = (undefined1 (*) [16])(in_RDI + -7 + (long)iVar23);
    uVar2 = *(undefined8 *)*pauVar1;
    auVar22 = *pauVar1;
    auVar21 = *pauVar1;
    auVar20 = *pauVar1;
    auVar19 = *pauVar1;
    auVar18 = *pauVar1;
    auVar17 = *pauVar1;
    local_ba8 = SUB168(*pauVar1,7);
    *in_RDX = local_ba8;
    local_b98 = auVar22._6_8_;
    *(undefined8 *)((long)in_RDX + (long)in_ECX) = local_b98;
    local_b88 = auVar21._5_8_;
    *(undefined8 *)((long)in_RDX + (long)(in_ECX * 2)) = local_b88;
    local_b78 = auVar20._4_8_;
    *(undefined8 *)((long)in_RDX + (long)(in_ECX * 3)) = local_b78;
    local_b68 = auVar19._3_8_;
    *(undefined8 *)((long)in_RDX + (long)(in_ECX << 2)) = local_b68;
    local_b58 = auVar18._2_8_;
    *(undefined8 *)((long)in_RDX + (long)(in_ECX * 5)) = local_b58;
    local_b48 = auVar17._1_8_;
    *(undefined8 *)((long)in_RDX + (long)(in_ECX * 6)) = local_b48;
    *(undefined8 *)((long)in_RDX + (long)(in_ECX * 7)) = uVar2;
  }
  else if (in_R8D == 0x10) {
    for (local_b20 = 0; local_b20 < 0x10; local_b20 = local_b20 + 8) {
      puVar26 = (undefined8 *)((in_RDI + iVar23) - (long)local_b20);
      uVar2 = puVar26[1];
      puVar27 = (undefined8 *)((in_RDI + iVar23) - (long)(local_b20 + 1));
      uVar3 = *puVar27;
      uVar4 = puVar27[1];
      puVar27 = (undefined8 *)((in_RDI + iVar23) - (long)(local_b20 + 2));
      uVar5 = *puVar27;
      uVar6 = puVar27[1];
      puVar27 = (undefined8 *)((in_RDI + iVar23) - (long)(local_b20 + 3));
      uVar7 = *puVar27;
      uVar8 = puVar27[1];
      puVar27 = (undefined8 *)((in_RDI + iVar23) - (long)(local_b20 + 4));
      uVar9 = *puVar27;
      uVar10 = puVar27[1];
      puVar27 = (undefined8 *)((in_RDI + iVar23) - (long)(local_b20 + 5));
      uVar11 = *puVar27;
      uVar12 = puVar27[1];
      puVar27 = (undefined8 *)((in_RDI + iVar23) - (long)(local_b20 + 6));
      uVar13 = *puVar27;
      uVar14 = puVar27[1];
      puVar27 = (undefined8 *)((in_RDI + iVar23) - (long)(local_b20 + 7));
      uVar15 = *puVar27;
      uVar16 = puVar27[1];
      puVar27 = (undefined8 *)((long)in_RDX + (long)(local_b20 * in_ECX));
      *puVar27 = *puVar26;
      puVar27[1] = uVar2;
      puVar26 = (undefined8 *)((long)in_RDX + (long)((local_b20 + 1) * in_ECX));
      *puVar26 = uVar3;
      puVar26[1] = uVar4;
      puVar26 = (undefined8 *)((long)in_RDX + (long)((local_b20 + 2) * in_ECX));
      *puVar26 = uVar5;
      puVar26[1] = uVar6;
      puVar26 = (undefined8 *)((long)in_RDX + (long)((local_b20 + 3) * in_ECX));
      *puVar26 = uVar7;
      puVar26[1] = uVar8;
      puVar26 = (undefined8 *)((long)in_RDX + (long)((local_b20 + 4) * in_ECX));
      *puVar26 = uVar9;
      puVar26[1] = uVar10;
      puVar26 = (undefined8 *)((long)in_RDX + (long)((local_b20 + 5) * in_ECX));
      *puVar26 = uVar11;
      puVar26[1] = uVar12;
      puVar26 = (undefined8 *)((long)in_RDX + (long)((local_b20 + 6) * in_ECX));
      *puVar26 = uVar13;
      puVar26[1] = uVar14;
      puVar26 = (undefined8 *)((long)in_RDX + (long)((local_b20 + 7) * in_ECX));
      *puVar26 = uVar15;
      puVar26[1] = uVar16;
    }
  }
  else {
    for (local_b20 = 0; local_b20 < in_R8D; local_b20 = local_b20 + 8) {
      uVar2 = ((undefined8 *)(local_b00 + iVar23))[1];
      uVar3 = *(undefined8 *)(local_b00 + iVar23 + 0x10);
      uVar4 = *(undefined8 *)(local_b00 + iVar23 + 0x18);
      uVar5 = *(undefined8 *)(local_b00 + iVar23 + -1);
      uVar6 = *(undefined8 *)(local_b00 + iVar23 + 7);
      uVar7 = *(undefined8 *)(local_b00 + iVar23 + 0xf);
      uVar8 = *(undefined8 *)(local_b00 + iVar23 + 0x17);
      uVar9 = *(undefined8 *)(local_b00 + iVar23 + -2);
      uVar10 = *(undefined8 *)(local_b00 + iVar23 + 6);
      uVar11 = *(undefined8 *)(local_b00 + iVar23 + 0xe);
      uVar12 = *(undefined8 *)(local_b00 + iVar23 + 0x16);
      uVar13 = *(undefined8 *)(local_b00 + iVar23 + -3);
      uVar14 = *(undefined8 *)(local_b00 + iVar23 + 5);
      uVar15 = *(undefined8 *)(local_b00 + iVar23 + 0xd);
      uVar16 = *(undefined8 *)(local_b00 + iVar23 + 0x15);
      *local_b10 = *(undefined8 *)(local_b00 + iVar23);
      local_b10[1] = uVar2;
      local_b10[2] = uVar3;
      local_b10[3] = uVar4;
      *(undefined8 *)((long)local_b10 + (long)in_ECX) = uVar5;
      ((undefined8 *)((long)local_b10 + (long)in_ECX))[1] = uVar6;
      puVar26 = (undefined8 *)((long)local_b10 + (long)in_ECX + 0x10);
      *puVar26 = uVar7;
      puVar26[1] = uVar8;
      puVar26 = (undefined8 *)((long)local_b10 + (long)(in_ECX << 1));
      *puVar26 = uVar9;
      puVar26[1] = uVar10;
      puVar26 = (undefined8 *)((long)local_b10 + (long)(in_ECX << 1) + 0x10);
      *puVar26 = uVar11;
      puVar26[1] = uVar12;
      puVar26 = (undefined8 *)((long)local_b10 + (long)(in_ECX * 3));
      *puVar26 = uVar13;
      puVar26[1] = uVar14;
      puVar26 = (undefined8 *)((long)local_b10 + (long)(in_ECX * 3) + 0x10);
      *puVar26 = uVar15;
      puVar26[1] = uVar16;
      uVar2 = *(undefined8 *)(local_b00 + iVar23 + 4);
      uVar3 = *(undefined8 *)(local_b00 + iVar23 + 0xc);
      uVar4 = *(undefined8 *)(local_b00 + iVar23 + 0x14);
      uVar5 = *(undefined8 *)(local_b00 + iVar23 + -5);
      uVar6 = *(undefined8 *)(local_b00 + iVar23 + 3);
      uVar7 = *(undefined8 *)(local_b00 + iVar23 + 0xb);
      uVar8 = *(undefined8 *)(local_b00 + iVar23 + 0x13);
      uVar9 = *(undefined8 *)(local_b00 + iVar23 + -6);
      uVar10 = *(undefined8 *)(local_b00 + iVar23 + 2);
      uVar11 = *(undefined8 *)(local_b00 + iVar23 + 10);
      uVar12 = *(undefined8 *)(local_b00 + iVar23 + 0x12);
      uVar13 = *(undefined8 *)(local_b00 + iVar23 + -7);
      uVar14 = *(undefined8 *)(local_b00 + iVar23 + 1);
      uVar15 = *(undefined8 *)(local_b00 + iVar23 + 9);
      uVar16 = *(undefined8 *)(local_b00 + iVar23 + 0x11);
      puVar26 = (undefined8 *)((long)local_b10 + (long)(in_ECX << 2));
      *puVar26 = *(undefined8 *)(local_b00 + iVar23 + -4);
      puVar26[1] = uVar2;
      puVar26 = (undefined8 *)((long)local_b10 + (long)(in_ECX << 2) + 0x10);
      *puVar26 = uVar3;
      puVar26[1] = uVar4;
      puVar26 = (undefined8 *)((long)local_b10 + (long)(in_ECX * 5));
      *puVar26 = uVar5;
      puVar26[1] = uVar6;
      puVar26 = (undefined8 *)((long)local_b10 + (long)(in_ECX * 5) + 0x10);
      *puVar26 = uVar7;
      puVar26[1] = uVar8;
      puVar26 = (undefined8 *)((long)local_b10 + (long)(in_ECX * 6));
      *puVar26 = uVar9;
      puVar26[1] = uVar10;
      puVar26 = (undefined8 *)((long)local_b10 + (long)(in_ECX * 6) + 0x10);
      *puVar26 = uVar11;
      puVar26[1] = uVar12;
      puVar26 = (undefined8 *)((long)local_b10 + (long)(in_ECX * 7));
      *puVar26 = uVar13;
      puVar26[1] = uVar14;
      puVar26 = (undefined8 *)((long)local_b10 + (long)(in_ECX * 7) + 0x10);
      *puVar26 = uVar15;
      puVar26[1] = uVar16;
      local_b00 = local_b00 + -8;
      local_b10 = (undefined8 *)((long)local_b10 + (long)(in_ECX << 3));
    }
  }
  return;
}

Assistant:

void ihevc_intra_pred_luma_mode_18_34_ssse3(UWORD8 *pu1_ref,
                                            WORD32 src_strd,
                                            UWORD8 *pu1_dst,
                                            WORD32 dst_strd,
                                            WORD32 nt,
                                            WORD32 mode)
{
    WORD32 row;
    WORD32 two_nt = 2 * nt;
    __m128i src_temp1, src_temp2, src_temp3, src_temp4, src_temp5, src_temp6, src_temp7, src_temp8;
    UNUSED(src_strd);
    if(mode == 34)
    {
        if(nt == 4)
        {

            int temp1, temp2, temp3, temp4;

            /*pu1_ref[two_nt + col + idx + 1]*/
            src_temp1 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 2));
            src_temp2 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 3));
            src_temp3 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 4));
            src_temp4 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 5));

            temp1 = _mm_cvtsi128_si32(src_temp1);
            temp2 = _mm_cvtsi128_si32(src_temp2);
            temp3 = _mm_cvtsi128_si32(src_temp3);
            temp4 = _mm_cvtsi128_si32(src_temp4);

            /*pu1_dst[(row * dst_strd) + col] = pu1_ref[two_nt - 1 - row];*/
            *(WORD32 *)(&pu1_dst[(0 * dst_strd)]) = temp1;
            *(WORD32 *)(&pu1_dst[(1 * dst_strd)]) = temp2;
            *(WORD32 *)(&pu1_dst[(2 * dst_strd)]) = temp3;
            *(WORD32 *)(&pu1_dst[(3 * dst_strd)]) = temp4;

        }
        else if(nt == 8)
        {
            /*pu1_ref[two_nt + col + idx + 1]*/
            src_temp1 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 2));
            src_temp2 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 3));
            src_temp3 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 4));
            src_temp4 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 5));
            src_temp5 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 6));
            src_temp6 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 7));
            src_temp7 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 8));
            src_temp8 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 9));

            _mm_storel_epi64((__m128i *)(pu1_dst + (0 * dst_strd)), src_temp1);
            _mm_storel_epi64((__m128i *)(pu1_dst + (1 * dst_strd)), src_temp2);
            _mm_storel_epi64((__m128i *)(pu1_dst + (2 * dst_strd)), src_temp3);
            _mm_storel_epi64((__m128i *)(pu1_dst + (3 * dst_strd)), src_temp4);
            _mm_storel_epi64((__m128i *)(pu1_dst + (4 * dst_strd)), src_temp5);
            _mm_storel_epi64((__m128i *)(pu1_dst + (5 * dst_strd)), src_temp6);
            _mm_storel_epi64((__m128i *)(pu1_dst + (6 * dst_strd)), src_temp7);
            _mm_storel_epi64((__m128i *)(pu1_dst + (7 * dst_strd)), src_temp8);

        }
        else if(nt == 16)
        {
            for(row = 0; row < nt; row += 8)
            {
                /*pu1_ref[two_nt + col + idx + 1]*/
                src_temp1 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + (row + 0) + 2));
                src_temp2 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + (row + 1) + 2));
                src_temp3 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + (row + 2) + 2));
                src_temp4 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + (row + 3) + 2));
                src_temp5 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + (row + 4) + 2));
                src_temp6 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + (row + 5) + 2));
                src_temp7 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + (row + 6) + 2));
                src_temp8 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + (row + 7) + 2));

                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 0) * dst_strd)), src_temp1);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 1) * dst_strd)), src_temp2);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 2) * dst_strd)), src_temp3);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 3) * dst_strd)), src_temp4);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 4) * dst_strd)), src_temp5);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 5) * dst_strd)), src_temp6);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 6) * dst_strd)), src_temp7);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 7) * dst_strd)), src_temp8);


            }
        }
        else
        {
            __m128i src_temp9, src_temp10, src_temp11, src_temp12, src_temp13, src_temp14, src_temp15, src_temp16;
            for(row = 0; row < nt; row += 8)
            {
                /*pu1_ref[two_nt + col + idx + 1]*/
                src_temp1  = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + (0 + 0) + 2));
                src_temp9  = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + (0 + 16) + 2));
                src_temp2  = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + (1 + 0) + 2));
                src_temp10 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + (1 + 16) + 2));
                src_temp3  = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + (2 + 0) + 2));
                src_temp11 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + (2 + 16) + 2));
                src_temp4  = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + (3 + 0) + 2));
                src_temp12 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + (3 + 16) + 2));

                _mm_storeu_si128((__m128i *)(pu1_dst +  0 + (0 * dst_strd)), src_temp1);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + (0 * dst_strd)), src_temp9);
                _mm_storeu_si128((__m128i *)(pu1_dst +  0 + (1 * dst_strd)), src_temp2);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + (1 * dst_strd)), src_temp10);
                _mm_storeu_si128((__m128i *)(pu1_dst +  0 + (2 * dst_strd)), src_temp3);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + (2 * dst_strd)), src_temp11);
                _mm_storeu_si128((__m128i *)(pu1_dst +  0 + (3 * dst_strd)), src_temp4);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + (3 * dst_strd)), src_temp12);

                src_temp5  = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + (4 + 0) + 2));
                src_temp13 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + (4 + 16) + 2));
                src_temp6  = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + (5 + 0) + 2));
                src_temp14 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + (5 + 16) + 2));
                src_temp7  = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + (6 + 0) + 2));
                src_temp15 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + (6 + 16) + 2));
                src_temp8  = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + (7 + 0) + 2));
                src_temp16 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + (7 + 16) + 2));

                _mm_storeu_si128((__m128i *)(pu1_dst +  0 + (4 * dst_strd)), src_temp5);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + (4 * dst_strd)), src_temp13);
                _mm_storeu_si128((__m128i *)(pu1_dst +  0 + (5 * dst_strd)), src_temp6);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + (5 * dst_strd)), src_temp14);
                _mm_storeu_si128((__m128i *)(pu1_dst +  0 + (6 * dst_strd)), src_temp7);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + (6 * dst_strd)), src_temp15);
                _mm_storeu_si128((__m128i *)(pu1_dst +  0 + (7 * dst_strd)), src_temp8);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + (7 * dst_strd)), src_temp16);

                pu1_ref += 8;
                pu1_dst += 8 * dst_strd;
            }
        }
    }
    else
    {
        if(nt == 4)
        {
            int temp1, temp2, temp3, temp4;

            /*pu1_ref[two_nt + col + idx + 1]*/
            src_temp1 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt - 3));
            src_temp2 = _mm_srli_si128(src_temp1, 1);
            src_temp3 = _mm_srli_si128(src_temp1, 2);
            src_temp4 = _mm_srli_si128(src_temp1, 3);

            temp1 = _mm_cvtsi128_si32(src_temp4);
            temp2 = _mm_cvtsi128_si32(src_temp3);
            temp3 = _mm_cvtsi128_si32(src_temp2);
            temp4 = _mm_cvtsi128_si32(src_temp1);

            /*pu1_dst[(row * dst_strd) + col] = pu1_ref[two_nt - 1 - row];*/
            *(WORD32 *)(&pu1_dst[(0 * dst_strd)]) = temp1;
            *(WORD32 *)(&pu1_dst[(1 * dst_strd)]) = temp2;
            *(WORD32 *)(&pu1_dst[(2 * dst_strd)]) = temp3;
            *(WORD32 *)(&pu1_dst[(3 * dst_strd)]) = temp4;

        }
        else if(nt == 8)
        {
            /*pu1_ref[two_nt + col + idx + 1]*/
            src_temp1 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt - 7));
            src_temp2 = _mm_srli_si128(src_temp1, 1);
            src_temp3 = _mm_srli_si128(src_temp1, 2);
            src_temp4 = _mm_srli_si128(src_temp1, 3);
            src_temp5 = _mm_srli_si128(src_temp1, 4);
            src_temp6 = _mm_srli_si128(src_temp1, 5);
            src_temp7 = _mm_srli_si128(src_temp1, 6);
            src_temp8 = _mm_srli_si128(src_temp1, 7);

            _mm_storel_epi64((__m128i *)(pu1_dst + (0 * dst_strd)), src_temp8);
            _mm_storel_epi64((__m128i *)(pu1_dst + (1 * dst_strd)), src_temp7);
            _mm_storel_epi64((__m128i *)(pu1_dst + (2 * dst_strd)), src_temp6);
            _mm_storel_epi64((__m128i *)(pu1_dst + (3 * dst_strd)), src_temp5);
            _mm_storel_epi64((__m128i *)(pu1_dst + (4 * dst_strd)), src_temp4);
            _mm_storel_epi64((__m128i *)(pu1_dst + (5 * dst_strd)), src_temp3);
            _mm_storel_epi64((__m128i *)(pu1_dst + (6 * dst_strd)), src_temp2);
            _mm_storel_epi64((__m128i *)(pu1_dst + (7 * dst_strd)), src_temp1);


        }
        else if(nt == 16)
        {
            for(row = 0; row < nt; row += 8)
            {
                /*pu1_ref[two_nt + col + idx + 1]*/
                src_temp1 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt - (row + 0)));
                src_temp2 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt - (row + 1)));
                src_temp3 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt - (row + 2)));
                src_temp4 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt - (row + 3)));
                src_temp5 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt - (row + 4)));
                src_temp6 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt - (row + 5)));
                src_temp7 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt - (row + 6)));
                src_temp8 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt - (row + 7)));

                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 0) * dst_strd)), src_temp1);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 1) * dst_strd)), src_temp2);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 2) * dst_strd)), src_temp3);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 3) * dst_strd)), src_temp4);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 4) * dst_strd)), src_temp5);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 5) * dst_strd)), src_temp6);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 6) * dst_strd)), src_temp7);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 7) * dst_strd)), src_temp8);

            }

        }
        else
        {
            __m128i src_temp9, src_temp10, src_temp11, src_temp12, src_temp13, src_temp14, src_temp15, src_temp16;
            for(row = 0; row < nt; row += 8)
            {
                /*pu1_ref[two_nt + col + idx + 1]*/
                src_temp1  = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt - 0 + 0));
                src_temp9  = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt - 0 + 16));
                src_temp2  = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt - 1 + 0));
                src_temp10 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt - 1 + 16));
                src_temp3  = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt - 2 + 0));
                src_temp11 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt - 2 + 16));
                src_temp4  = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt - 3 + 0));
                src_temp12 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt - 3 + 16));

                _mm_storeu_si128((__m128i *)(pu1_dst +  0 + (0 * dst_strd)), src_temp1);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + (0 * dst_strd)), src_temp9);
                _mm_storeu_si128((__m128i *)(pu1_dst +  0 + (1 * dst_strd)), src_temp2);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + (1 * dst_strd)), src_temp10);
                _mm_storeu_si128((__m128i *)(pu1_dst +  0 + (2 * dst_strd)), src_temp3);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + (2 * dst_strd)), src_temp11);
                _mm_storeu_si128((__m128i *)(pu1_dst +  0 + (3 * dst_strd)), src_temp4);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + (3 * dst_strd)), src_temp12);

                src_temp5  = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt - 4 + 0));
                src_temp13 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt - 4 + 16));
                src_temp6  = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt - 5 + 0));
                src_temp14 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt - 5 + 16));
                src_temp7  = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt - 6 + 0));
                src_temp15 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt - 6 + 16));
                src_temp8  = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt - 7 + 0));
                src_temp16 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt - 7 + 16));

                _mm_storeu_si128((__m128i *)(pu1_dst +  0 + (4 * dst_strd)), src_temp5);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + (4 * dst_strd)), src_temp13);
                _mm_storeu_si128((__m128i *)(pu1_dst +  0 + (5 * dst_strd)), src_temp6);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + (5 * dst_strd)), src_temp14);
                _mm_storeu_si128((__m128i *)(pu1_dst +  0 + (6 * dst_strd)), src_temp7);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + (6 * dst_strd)), src_temp15);
                _mm_storeu_si128((__m128i *)(pu1_dst +  0 + (7 * dst_strd)), src_temp8);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + (7 * dst_strd)), src_temp16);

                pu1_ref -= 8;
                pu1_dst += 8 * dst_strd;
            }
        }
    }
}